

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O1

int64_t parse_assignment(void)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  uint uVar3;
  int iVar4;
  int64_t extraout_RAX;
  int64_t iVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  int64_t extraout_RAX_00;
  uint unaff_EBP;
  char *pcVar9;
  size_t sVar10;
  long lVar11;
  uint local_34;
  
  local_34 = next_char();
  if ((int)local_34 < 0x2e) {
    if (local_34 == 0x23) {
LAB_00111eec:
      prev_char(local_34);
      return -1;
    }
    if (local_34 == 0xffffffff) goto LAB_00112443;
  }
  else {
    if (local_34 == 0x40) goto LAB_00111eec;
    if (local_34 == 0x2e) {
      do {
        uVar3 = next_char();
      } while (uVar3 == 0x20);
      if (uVar3 == 10) {
        msg(4,"read terminating \'.\'");
        found_end_of_witness = 1;
        return -1;
      }
      if (uVar3 == 0xffffffff) {
        pcVar9 = "end-of-file after \'.\' instead of new-line";
        local_34 = 0xffffffff;
        goto LAB_00112418;
      }
      local_34 = uVar3;
      iVar4 = isprint(uVar3);
      if (iVar4 == 0) {
        pcVar9 = "unexpected character code 0x%02x after \'.\'";
      }
      else {
        pcVar9 = "unexpected character \'%c\' after \'.\'";
      }
      parse_error(pcVar9,(ulong)uVar3);
LAB_0011240d:
      pcVar9 = "unexpected end-of-file in assignment";
      local_34 = unaff_EBP;
      goto LAB_00112418;
    }
  }
  prev_char(local_34);
  iVar5 = parse_unsigned_number((int32_t *)&local_34);
  if (local_34 != 0x20) {
    parse_error("space missing after \'%ld\'",iVar5);
    goto LAB_0011245d;
  }
  local_34 = next_char();
  _ZL11array_index_1 = _ZL11array_index_0;
  if (local_34 == 0x5b) {
    index_columno = columno + 1;
    uVar3 = next_char();
    puVar8 = _ZL11array_index_0;
    puVar1 = _ZL11array_index_1;
    while (_ZL11array_index_0 = puVar8, _ZL11array_index_1 = puVar1, (uVar3 & 0xfffffffe) == 0x30) {
      if (puVar1 == _ZL11array_index_2) {
        sVar10 = ((long)_ZL11array_index_2 - (long)puVar8) * 2;
        if (_ZL11array_index_2 == puVar8) {
          sVar10 = 1;
        }
        puVar6 = (undefined8 *)realloc(puVar8,sVar10);
        if (puVar6 == (undefined8 *)0x0) goto LAB_0011242b;
        _ZL11array_index_1 = (undefined8 *)(((long)puVar1 - (long)puVar8) + (long)puVar6);
        _ZL11array_index_2 = (undefined8 *)(sVar10 + (long)puVar6);
        _ZL11array_index_0 = puVar6;
      }
      puVar8 = (undefined8 *)((long)_ZL11array_index_1 + 1);
      *(char *)_ZL11array_index_1 = (char)uVar3;
      _ZL11array_index_1 = puVar8;
      uVar3 = next_char();
      puVar8 = _ZL11array_index_0;
      puVar1 = _ZL11array_index_1;
    }
    local_34 = uVar3;
    if (uVar3 == 0x2a) {
      if (puVar1 == _ZL11array_index_2) {
        sVar10 = 1;
        if (_ZL11array_index_2 != puVar8) {
          sVar10 = ((long)_ZL11array_index_2 - (long)puVar8) * 2;
        }
        puVar6 = puVar8;
        puVar7 = (undefined8 *)realloc(puVar8,sVar10);
        if (puVar7 == (undefined8 *)0x0) goto LAB_00112490;
        _ZL11array_index_1 = (undefined8 *)(((long)puVar1 - (long)puVar8) + (long)puVar7);
        _ZL11array_index_2 = (undefined8 *)(sVar10 + (long)puVar7);
        _ZL11array_index_0 = puVar7;
      }
      puVar8 = (undefined8 *)((long)_ZL11array_index_1 + 1);
      *(undefined1 *)_ZL11array_index_1 = 0x2a;
      _ZL11array_index_1 = puVar8;
      local_34 = next_char();
    }
    puVar1 = _ZL11array_index_1;
    puVar8 = _ZL11array_index_0;
    if (local_34 != 0x5d) {
      pcVar9 = "expected ] after index";
      goto LAB_00112418;
    }
    if (_ZL11array_index_1 == _ZL11array_index_0) {
      pcVar9 = "empty index";
      goto LAB_00112418;
    }
    if (_ZL11array_index_1 != _ZL11array_index_2) {
LAB_0011210e:
      puVar8 = (undefined8 *)((long)_ZL11array_index_1 + 1);
      *(undefined1 *)_ZL11array_index_1 = 0;
      _ZL11array_index_1 = puVar8;
      local_34 = next_char();
      if (local_34 != 0x20) {
        pcVar9 = "space missing after index";
        goto LAB_00112418;
      }
      goto LAB_00112144;
    }
    sVar10 = 1;
    if (_ZL11array_index_2 != _ZL11array_index_0) {
      sVar10 = ((long)_ZL11array_index_2 - (long)_ZL11array_index_0) * 2;
    }
    puVar6 = _ZL11array_index_0;
    puVar7 = (undefined8 *)realloc(_ZL11array_index_0,sVar10);
    if (puVar7 != (undefined8 *)0x0) {
      _ZL11array_index_1 = (undefined8 *)(((long)puVar1 - (long)puVar8) + (long)puVar7);
      _ZL11array_index_2 = (undefined8 *)(sVar10 + (long)puVar7);
      _ZL11array_index_0 = puVar7;
      goto LAB_0011210e;
    }
  }
  else {
    prev_char(local_34);
LAB_00112144:
    _ZL8constant_1 = _ZL8constant_0;
    constant_columno = columno + 1;
    uVar3 = next_char();
    puVar8 = _ZL8constant_0;
    puVar1 = _ZL8constant_1;
    while (_ZL8constant_0 = puVar8, _ZL8constant_1 = puVar1, (uVar3 & 0xfffffffe) == 0x30) {
      if (puVar1 == _ZL8constant_2) {
        sVar10 = ((long)_ZL8constant_2 - (long)puVar8) * 2;
        if (_ZL8constant_2 == puVar8) {
          sVar10 = 1;
        }
        puVar6 = (undefined8 *)realloc(puVar8,sVar10);
        if (puVar6 == (undefined8 *)0x0) goto LAB_0011241f;
        _ZL8constant_1 = (undefined8 *)(((long)puVar1 - (long)puVar8) + (long)puVar6);
        _ZL8constant_2 = (undefined8 *)(sVar10 + (long)puVar6);
        _ZL8constant_0 = puVar6;
      }
      puVar8 = (undefined8 *)((long)_ZL8constant_1 + 1);
      *(char *)_ZL8constant_1 = (char)uVar3;
      _ZL8constant_1 = puVar8;
      uVar3 = next_char();
      puVar8 = _ZL8constant_0;
      puVar1 = _ZL8constant_1;
    }
    local_34 = uVar3;
    if (puVar1 == puVar8) {
LAB_0011245d:
      pcVar9 = "empty constant";
      goto LAB_00112418;
    }
    if ((uVar3 != 10) && (uVar3 != 0x20)) {
      pcVar9 = "expected space or new-line after assignment";
      goto LAB_00112418;
    }
    if (puVar1 == _ZL8constant_2) {
      sVar10 = 1;
      if (_ZL8constant_2 != puVar8) {
        sVar10 = ((long)_ZL8constant_2 - (long)puVar8) * 2;
      }
      puVar6 = puVar8;
      puVar7 = (undefined8 *)realloc(puVar8,sVar10);
      if (puVar7 != (undefined8 *)0x0) {
        _ZL8constant_1 = (undefined8 *)(((long)puVar1 - (long)puVar8) + (long)puVar7);
        _ZL8constant_2 = (undefined8 *)(sVar10 + (long)puVar7);
        _ZL8constant_0 = puVar7;
        goto LAB_00112284;
      }
      parse_assignment();
    }
    else {
LAB_00112284:
      puVar8 = (undefined8 *)((long)_ZL8constant_1 + 1);
      *(undefined1 *)_ZL8constant_1 = 0;
      _ZL8constant_1 = puVar8;
      _ZL6symbol_1 = _ZL6symbol_0;
      unaff_EBP = local_34;
      while ((unaff_EBP != 10 &&
             (unaff_EBP = next_char(), puVar1 = _ZL6symbol_1, puVar8 = _ZL6symbol_0, unaff_EBP != 10
             ))) {
        if (unaff_EBP == 0xffffffff) goto LAB_0011240d;
        if (_ZL6symbol_1 == _ZL6symbol_2) {
          sVar10 = ((long)_ZL6symbol_2 - (long)_ZL6symbol_0) * 2;
          if (_ZL6symbol_2 == _ZL6symbol_0) {
            sVar10 = 1;
          }
          puVar6 = (undefined8 *)realloc(_ZL6symbol_0,sVar10);
          if (puVar6 == (undefined8 *)0x0) {
            do {
              parse_assignment();
LAB_00112443:
              pcVar9 = "unexpected end-of-file (without \'.\')";
LAB_00112418:
              parse_error(pcVar9);
LAB_0011241f:
              parse_assignment();
LAB_0011242b:
              parse_assignment();
            } while( true );
          }
          _ZL6symbol_1 = (undefined8 *)(((long)puVar1 - (long)puVar8) + (long)puVar6);
          _ZL6symbol_2 = (undefined8 *)(sVar10 + (long)puVar6);
          _ZL6symbol_0 = puVar6;
        }
        puVar8 = (undefined8 *)((long)_ZL6symbol_1 + 1);
        *(char *)_ZL6symbol_1 = (char)unaff_EBP;
        _ZL6symbol_1 = puVar8;
      }
      lVar11 = (long)_ZL6symbol_1 - (long)_ZL6symbol_0;
      if (lVar11 == 0) {
        return iVar5;
      }
      if (_ZL6symbol_1 != _ZL6symbol_2) {
LAB_001123b9:
        puVar2 = (undefined1 *)((long)_ZL6symbol_1 + 1);
        *(undefined1 *)_ZL6symbol_1 = 0;
        _ZL6symbol_1 = (undefined8 *)puVar2;
        return iVar5;
      }
      sVar10 = 1;
      if (_ZL6symbol_2 != _ZL6symbol_0) {
        sVar10 = ((long)_ZL6symbol_2 - (long)_ZL6symbol_0) * 2;
      }
      puVar6 = _ZL6symbol_0;
      local_34 = unaff_EBP;
      puVar8 = (undefined8 *)realloc(_ZL6symbol_0,sVar10);
      if (puVar8 != (undefined8 *)0x0) {
        _ZL6symbol_1 = (undefined8 *)(lVar11 + (long)puVar8);
        _ZL6symbol_2 = (undefined8 *)(sVar10 + (long)puVar8);
        _ZL6symbol_0 = puVar8;
        goto LAB_001123b9;
      }
    }
    parse_assignment();
  }
  parse_assignment();
LAB_00112490:
  parse_assignment();
  if ((void *)*puVar6 == (void *)0x0) {
    return extraout_RAX_00;
  }
  operator_delete((void *)*puVar6);
  return extraout_RAX;
}

Assistant:

static int64_t
parse_assignment ()
{
  int32_t ch = next_char ();
  if (ch == EOF) parse_error ("unexpected end-of-file (without '.')");
  if (ch == '.')
  {
    while ((ch = next_char ()) == ' ')
      ;
    if (ch == EOF) parse_error ("end-of-file after '.' instead of new-line");
    if (ch != '\n')
    {
      if (isprint (ch))
        parse_error ("unexpected character '%c' after '.'", ch);
      else
        parse_error ("unexpected character code 0x%02x after '.'", ch);
    }
    msg (4, "read terminating '.'");
    found_end_of_witness = 1;
    return -1;
  }
  if (ch == '@' || ch == '#')
  {
    prev_char (ch);
    return -1;
  }
  prev_char (ch);
  int64_t res = parse_unsigned_number (&ch);
  if (ch != ' ') parse_error ("space missing after '%" PRId64 "'", res);
  ch = next_char ();
  BTOR2_RESET_STACK (array_index);
  if (ch == '[')
  {
    index_columno = columno + 1;
    while ((ch = next_char ()) == '0' || ch == '1')
      BTOR2_PUSH_STACK (array_index, ch);
    /* btormc trace compatibility: btormc --trace-gen-full represents
     * 'initialize all array elements' as <id> [*] <value> */
    if (ch == '*')
    {
      BTOR2_PUSH_STACK (array_index, ch);
      ch = next_char ();
    }
    if (ch != ']') parse_error ("expected ] after index");
    if (BTOR2_EMPTY_STACK (array_index)) parse_error ("empty index");
    BTOR2_PUSH_STACK (array_index, 0);
    ch = next_char ();
    if (ch != ' ') parse_error ("space missing after index");
  }
  else
  {
    prev_char (ch);
  }
  BTOR2_RESET_STACK (constant);
  constant_columno = columno + 1;
  while ((ch = next_char ()) == '0' || ch == '1')
    BTOR2_PUSH_STACK (constant, ch);
  if (BTOR2_EMPTY_STACK (constant))
    parse_error ("empty constant");
  else if (ch != ' ' && ch != '\n')
    parse_error ("expected space or new-line after assignment");
  BTOR2_PUSH_STACK (constant, 0);
  BTOR2_RESET_STACK (symbol);
  while (ch != '\n')
    if ((ch = next_char ()) == EOF)
      parse_error ("unexpected end-of-file in assignment");
    else if (ch != '\n')
      BTOR2_PUSH_STACK (symbol, ch);
  if (!BTOR2_EMPTY_STACK (symbol)) BTOR2_PUSH_STACK (symbol, 0);
  return res;
}